

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_add_qua_as_tri(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *qua_nodes)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  REF_INT local_168;
  undefined4 uStack_164;
  REF_INT RStack_160;
  REF_INT local_15c;
  REF_GLOB qua_global [27];
  
  local_15c = qua_nodes[4];
  lVar2 = -1;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    iVar1 = qua_nodes[lVar4];
    lVar6 = lVar2;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar6 = ref_node->global[iVar1], ref_node->global[iVar1] < 0)) {
      lVar6 = lVar2;
    }
    qua_global[lVar4] = lVar6;
  }
  if ((qua_global[0] < qua_global[1] && qua_global[0] < qua_global[3]) ||
     (qua_global[2] < qua_global[3] && qua_global[2] < qua_global[1])) {
    local_168 = *qua_nodes;
    uStack_164 = (undefined4)*(undefined8 *)(qua_nodes + 2);
    RStack_160 = (REF_INT)((ulong)*(undefined8 *)(qua_nodes + 2) >> 0x20);
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
    if (uVar3 == 0) {
      local_168 = (REF_INT)*(undefined8 *)qua_nodes;
      uStack_164 = (undefined4)((ulong)*(undefined8 *)qua_nodes >> 0x20);
      RStack_160 = qua_nodes[2];
      uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
      if (uVar3 == 0) {
        return 0;
      }
      uVar5 = 0x440;
    }
    else {
      uVar5 = 0x43c;
    }
  }
  else {
    local_168 = (REF_INT)*(undefined8 *)qua_nodes;
    uStack_164 = (undefined4)((ulong)*(undefined8 *)qua_nodes >> 0x20);
    RStack_160 = qua_nodes[3];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
    if (uVar3 == 0) {
      local_168 = (REF_INT)*(undefined8 *)(qua_nodes + 2);
      uStack_164 = (undefined4)((ulong)*(undefined8 *)(qua_nodes + 2) >> 0x20);
      RStack_160 = qua_nodes[1];
      uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
      if (uVar3 == 0) {
        return 0;
      }
      uVar5 = 0x44c;
    }
    else {
      uVar5 = 0x448;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar5,
         "ref_shard_add_qua_as_tri",(ulong)uVar3,"a tri");
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_qua_as_tri(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *qua_nodes) {
  REF_GLOB qua_global[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];

  tri_nodes[3] = qua_nodes[4]; /* patch id */

  for (node = 0; node < 4; node++)
    qua_global[node] = ref_node_global(ref_node, qua_nodes[node]);

  if ((qua_global[0] < qua_global[1] && qua_global[0] < qua_global[3]) ||
      (qua_global[2] < qua_global[1] &&
       qua_global[2] < qua_global[3])) { /* 0-2 diag split of quad */
                                         /* 2-1
                                            |\|
                                            3-0 */
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[2];
    tri_nodes[2] = qua_nodes[3];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[1];
    tri_nodes[2] = qua_nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
  } else { /* 3-1 diag split of quad */
           /* 2-1
              |/|
              3-0 */
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[1];
    tri_nodes[2] = qua_nodes[3];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
    tri_nodes[0] = qua_nodes[2];
    tri_nodes[1] = qua_nodes[3];
    tri_nodes[2] = qua_nodes[1];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
  }
  return REF_SUCCESS;
}